

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O1

void __thiscall
gmlc::containers::
SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>::
emplace<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
          (SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
           *this,unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *args)

{
  long lVar1;
  long lVar2;
  unique_lock<std::mutex> pushLock;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> local_40;
  unique_lock<std::mutex> local_30;
  
  local_40._M_owns = false;
  local_40._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  if (*(long *)(this + 0x50) == *(long *)(this + 0x58)) {
    std::unique_lock<std::mutex>::unlock(&local_40);
    local_30._M_device = (mutex_type *)(this + 0x28);
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    lVar1 = *(long *)(this + 0x68);
    lVar2 = *(long *)(this + 0x70);
    if (lVar1 == lVar2) {
      std::
      vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
      ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                  *)(this + 0x68),args);
      LOCK();
      this[0x80] = (SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
                    )0x0;
      UNLOCK();
    }
    else {
      std::unique_lock<std::mutex>::lock(&local_40);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    if (lVar1 == lVar2) goto LAB_001ee621;
  }
  std::
  vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
  ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
            ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
              *)(this + 0x50),args);
LAB_001ee621:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void emplace(Args&&... args)
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                // release the push lock
                pushLock.unlock();
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                if (pullElements.empty()) {
                    pullElements.emplace_back(std::forward<Args>(args)...);
                    queueEmptyFlag = false;
                    return;
                }
                // reengage the push lock so we can push next
                // LCOV_EXCL_START
                pushLock.lock();
                // LCOV_EXCL_STOP
            }
            pushElements.emplace_back(std::forward<Args>(args)...);
        }